

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O0

void __thiscall Fl_Type::write_properties(Fl_Type *this)

{
  int iVar1;
  char *pcVar2;
  Fl_Type *this_local;
  
  pcVar2 = label(this);
  if (pcVar2 != (char *)0x0) {
    write_indent(this->level + 1);
    write_word("label");
    pcVar2 = label(this);
    write_word(pcVar2);
  }
  pcVar2 = user_data(this);
  if (pcVar2 != (char *)0x0) {
    write_indent(this->level + 1);
    write_word("user_data");
    pcVar2 = user_data(this);
    write_word(pcVar2);
  }
  pcVar2 = user_data_type(this);
  if (pcVar2 != (char *)0x0) {
    write_word("user_data_type");
    pcVar2 = user_data_type(this);
    write_word(pcVar2);
  }
  pcVar2 = callback(this);
  if (pcVar2 != (char *)0x0) {
    write_indent(this->level + 1);
    write_word("callback");
    pcVar2 = callback(this);
    write_word(pcVar2);
  }
  pcVar2 = comment(this);
  if (pcVar2 != (char *)0x0) {
    write_indent(this->level + 1);
    write_word("comment");
    pcVar2 = comment(this);
    write_word(pcVar2);
  }
  iVar1 = (*this->_vptr_Fl_Type[0x16])();
  if ((iVar1 != 0) && (this->open_ != '\0')) {
    write_word("open");
  }
  if (this->selected != '\0') {
    write_word("selected");
  }
  return;
}

Assistant:

void Fl_Type::write_properties() {
  // repeat this for each attribute:
  if (label()) {
    write_indent(level+1);
    write_word("label");
    write_word(label());
  }
  if (user_data()) {
    write_indent(level+1);
    write_word("user_data");
    write_word(user_data());
  }
  if (user_data_type()) {
    write_word("user_data_type");
    write_word(user_data_type());
  }
  if (callback()) {
    write_indent(level+1);
    write_word("callback");
    write_word(callback());
  }
  if (comment()) {
    write_indent(level+1);
    write_word("comment");
    write_word(comment());
  }
  if (is_parent() && open_) write_word("open");
  if (selected) write_word("selected");
}